

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPiece.h
# Opt level: O2

string * __thiscall
sznet::StringPiece::as_string_abi_cxx11_(string *__return_storage_ptr__,StringPiece *this)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = this->m_ptr;
  iVar1 = this->m_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + iVar1);
  return __return_storage_ptr__;
}

Assistant:

string as_string() const
	{
		return string(data(), size());
	}